

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeFtest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  type_conflict5 tVar1;
  int iVar2;
  int iVar3;
  Verbosity VVar4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  int *piVar6;
  cpp_dec_float<100U,_int,_void> *u;
  cpp_dec_float<100U,_int,_void> *this_00;
  SPxOut *i_00;
  long in_RDI;
  streamsize prec;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  int i;
  int sparsitythreshold;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  theeps;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffb58;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffb60;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffb70;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffb78;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffb80;
  int local_444;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_440;
  undefined1 local_3f0 [80];
  int local_3a0;
  int local_39c;
  streamsize local_398;
  undefined4 local_38c;
  Verbosity local_388;
  undefined1 local_384 [80];
  undefined4 local_334;
  Verbosity local_330;
  undefined1 local_32c [80];
  undefined1 local_2dc [80];
  int local_28c;
  int local_288;
  undefined1 local_284 [80];
  int local_234;
  undefined4 local_230;
  undefined4 local_22c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  undefined8 local_1d0;
  long local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  undefined4 *local_1b8;
  long local_1b0;
  undefined4 *local_1a8;
  long local_1a0;
  undefined1 *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  undefined4 *local_188;
  undefined4 *local_180;
  long local_178;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_169;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  undefined1 *local_138;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_129;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  undefined1 *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined1 *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  long local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  int *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  int *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  int *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  entertol(in_stack_fffffffffffffb78);
  *(undefined1 *)(in_RDI + 0x5cc) = 1;
  *(undefined1 *)(in_RDI + 0x620) = 1;
  local_22c = 0;
  local_1a0 = in_RDI + 0x57c;
  local_1a8 = &local_22c;
  local_188 = local_1a8;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (in_stack_fffffffffffffb60,(long_long_type)in_stack_fffffffffffffb58);
  local_230 = 0;
  local_1b0 = in_RDI + 0x5d0;
  local_1b8 = &local_230;
  local_180 = local_1b8;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (in_stack_fffffffffffffb60,(long_long_type)in_stack_fffffffffffffb58);
  *(undefined4 *)(in_RDI + 0x624) = 0;
  IdxSet::clear((IdxSet *)(in_RDI + 0xed0));
  local_288 = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x518e06);
  local_70 = local_284;
  local_80 = &local_288;
  local_78 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(in_RDI + 0x87c);
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_81,
             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(in_RDI + 0x87c));
  local_68 = local_284;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffb60);
  local_50 = local_284;
  local_58 = local_78;
  local_60 = local_80;
  local_90 = (long)*local_80;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,(longlong *)0x518ece);
  local_234 = boost::multiprecision::number::operator_cast_to_int
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x518edb);
  for (local_28c = 0; iVar3 = local_28c,
      iVar2 = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x518f02), iVar3 < iVar2; local_28c = local_28c + 1) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffb60,(int)((ulong)in_stack_fffffffffffffb58 >> 0x20));
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffb60,(int)((ulong)in_stack_fffffffffffffb58 >> 0x20));
    tVar1 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffb58,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x518f52);
    iVar3 = (int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
    if (tVar1) {
      pnVar5 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_fffffffffffffb60,iVar3);
      local_128 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_fffffffffffffb60,
                               (int)((ulong)in_stack_fffffffffffffb58 >> 0x20));
      local_118 = local_2dc;
      local_120 = pnVar5;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_129,pnVar5,local_128);
      local_110 = local_2dc;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffffb60);
      local_f8 = local_2dc;
      local_100 = local_120;
      local_108 = local_128;
      boost::multiprecision::default_ops::
      eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                 (cpp_dec_float<100U,_int,_void> *)0x51903f);
    }
    else {
      pnVar5 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_fffffffffffffb60,iVar3);
      local_168 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_fffffffffffffb60,
                               (int)((ulong)in_stack_fffffffffffffb58 >> 0x20));
      local_158 = local_2dc;
      local_160 = pnVar5;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_169,pnVar5,local_168);
      local_150 = local_2dc;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffffb60);
      local_138 = local_2dc;
      local_140 = local_160;
      local_148 = local_168;
      boost::multiprecision::default_ops::
      eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                 (cpp_dec_float<100U,_int,_void> *)0x519125);
    }
    local_190 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffffb60,
                             (int)((ulong)in_stack_fffffffffffffb58 >> 0x20));
    local_198 = local_2dc;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    iVar3 = (int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
    if (*(int *)(in_RDI + 0xf88) == 0) {
      in_stack_fffffffffffffb80 =
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)in_stack_fffffffffffffb60,iVar3);
      local_b0 = local_32c;
      local_b8 = &local_228;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_b9,local_b8);
      local_a0 = local_32c;
      local_a8 = local_b8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      local_98 = local_32c;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
                (in_stack_fffffffffffffb60);
      tVar1 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffb58,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x519232);
      if (tVar1) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_fffffffffffffb60,(int)((ulong)in_stack_fffffffffffffb58 >> 0x20));
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator-=(in_stack_fffffffffffffb80,(self_type *)in_stack_fffffffffffffb78);
        DIdxSet::addIdx((DIdxSet *)in_stack_fffffffffffffb60,
                        (int)((ulong)in_stack_fffffffffffffb58 >> 0x20));
        piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0xf50),local_28c);
        *piVar6 = 1;
        *(int *)(in_RDI + 0x624) = *(int *)(in_RDI + 0x624) + 1;
      }
      else {
        piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0xf50),local_28c);
        *piVar6 = 0;
      }
      iVar3 = IdxSet::size((IdxSet *)(in_RDI + 0xed0));
      if (local_234 < iVar3) {
        if ((*(long *)(in_RDI + 0x1000) != 0) &&
           (VVar4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x1000)), 3 < (int)VVar4)) {
          local_330 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x1000));
          local_334 = 4;
          (**(code **)(**(long **)(in_RDI + 0x1000) + 0x10))(*(long **)(in_RDI + 0x1000),&local_334)
          ;
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58);
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffb60,
                             (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffb58);
          (**(code **)(**(long **)(in_RDI + 0x1000) + 0x10))(*(long **)(in_RDI + 0x1000),&local_330)
          ;
        }
        *(undefined4 *)(in_RDI + 0xf88) = 5;
        *(undefined1 *)(in_RDI + 0xf80) = 0;
        IdxSet::clear((IdxSet *)(in_RDI + 0xed0));
      }
    }
    else {
      in_stack_fffffffffffffb78 =
           (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffffb60,iVar3);
      local_e0 = local_384;
      local_e8 = &local_228;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_e9,local_e8);
      local_d0 = local_384;
      local_d8 = local_e8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      local_c8 = local_384;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
                (in_stack_fffffffffffffb60);
      tVar1 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffb58,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x519481);
      if (tVar1) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_fffffffffffffb60,(int)((ulong)in_stack_fffffffffffffb58 >> 0x20));
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator-=(in_stack_fffffffffffffb80,(self_type *)in_stack_fffffffffffffb78);
        *(int *)(in_RDI + 0x624) = *(int *)(in_RDI + 0x624) + 1;
      }
    }
  }
  iVar3 = IdxSet::size((IdxSet *)(in_RDI + 0xed0));
  if ((iVar3 == 0) && ((*(byte *)(in_RDI + 0xf80) & 1) == 0)) {
    *(int *)(in_RDI + 0xf88) = *(int *)(in_RDI + 0xf88) + -1;
  }
  else {
    iVar3 = IdxSet::size((IdxSet *)(in_RDI + 0xed0));
    if ((iVar3 <= local_234) && ((*(byte *)(in_RDI + 0xf80) & 1) == 0)) {
      if ((*(long *)(in_RDI + 0x1000) != 0) &&
         (VVar4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x1000)), 3 < (int)VVar4)) {
        local_388 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x1000));
        local_38c = 4;
        (**(code **)(**(long **)(in_RDI + 0x1000) + 0x10))(*(long **)(in_RDI + 0x1000),&local_38c);
        local_398 = SPxOut::precision((SPxOut *)0x5195d1);
        if ((*(byte *)(in_RDI + 0xf83) & 1) == 0) {
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58);
        }
        else {
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58);
        }
        u = (cpp_dec_float<100U,_int,_void> *)
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58
                              );
        local_39c = (int)std::setw(6);
        soplex::operator<<((SPxOut *)u,(_Setw)(int)((ulong)in_stack_fffffffffffffb60 >> 0x20));
        this_00 = (cpp_dec_float<100U,_int,_void> *)
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffb60,
                                     (_func_ios_base_ptr_ios_base_ptr *)u);
        local_3a0 = (int)std::setprecision(4);
        i_00 = soplex::operator<<((SPxOut *)u,(_Setprecision)(int)((ulong)this_00 >> 0x20));
        local_1c8 = in_RDI + 0x624;
        local_1c0 = &local_440;
        local_1d0 = 0;
        local_178 = local_1c8;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (in_stack_fffffffffffffb70,(longlong)i_00,this_00);
        local_444 = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x5196f9);
        local_28 = local_3f0;
        local_30 = &local_440;
        local_38 = &local_444;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_39,local_30);
        local_20 = local_3f0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00);
        local_8 = local_3f0;
        local_10 = local_30;
        local_18 = local_38;
        local_48 = (long)*local_38;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
                  (this_00,u,(longlong *)0x5197b9);
        soplex::operator<<((SPxOut *)this_00,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)u);
        soplex::operator<<((SPxOut *)this_00,(_func_ios_base_ptr_ios_base_ptr *)u);
        std::setprecision((int)local_398);
        soplex::operator<<((SPxOut *)u,(_Setprecision)(int)((ulong)this_00 >> 0x20));
        soplex::operator<<((SPxOut *)this_00,(_func_ostream_ptr_ostream_ptr *)u);
        (**(code **)(**(long **)(in_RDI + 0x1000) + 0x10))(*(long **)(in_RDI + 0x1000),&local_388);
      }
      *(undefined1 *)(in_RDI + 0xf80) = 1;
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeFtest()
{

   assert(type() == LEAVE);

   R theeps = entertol();
   m_pricingViolUpToDate = true;
   m_pricingViolCoUpToDate = true;
   m_pricingViol = 0;
   m_pricingViolCo = 0;
   m_numViol = 0;
   infeasibilities.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * dim());

   for(int i = 0; i < dim(); ++i)
   {
      theCoTest[i] = ((*theFvec)[i] > theUBbound[i])
                     ? theUBbound[i] - (*theFvec)[i]
                     : (*theFvec)[i] - theLBbound[i];

      if(remainingRoundsLeave == 0)
      {
         if(theCoTest[i] < -theeps)
         {
            m_pricingViol -= theCoTest[i];
            infeasibilities.addIdx(i);
            isInfeasible[i] = SPxPricer<R>::VIOLATED;
            ++m_numViol;
         }
         else
            isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;

         if(infeasibilities.size() > sparsitythreshold)
         {
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                          << std::endl;)
            remainingRoundsLeave = SOPLEX_DENSEROUNDS;
            sparsePricingLeave = false;
            infeasibilities.clear();
         }
      }
      else if(theCoTest[i] < -theeps)
      {
         m_pricingViol -= theCoTest[i];
         m_numViol++;
      }
   }

   if(infeasibilities.size() == 0 && !sparsePricingLeave)
   {
      --remainingRoundsLeave;
   }
   else if(infeasibilities.size() <= sparsitythreshold && !sparsePricingLeave)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingLeave)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) m_numViol / dim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingLeave = true;
   }
}